

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,uint start,uint num,long elements)

{
  LogMessage *pLVar1;
  string *psVar2;
  Type *pTVar3;
  ulong uVar4;
  ulong uVar5;
  RepeatedPtrFieldBase *this_00;
  LogFinisher local_129;
  RepeatedPtrFieldBase *local_128;
  ulong local_120;
  ulong local_118;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  uVar4 = (ulong)num;
  uVar5 = (ulong)start;
  local_128 = &this->super_RepeatedPtrFieldBase;
  if ((int)start < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x578);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  this_00 = local_128;
  if ((int)num < 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x579);
    pLVar1 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
    this_00 = local_128;
    internal::LogMessage::~LogMessage(&local_a0);
  }
  if (this_00->current_size_ < (int)(num + start)) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x57a);
    pLVar1 = internal::LogMessage::operator<<(&local_d8,"CHECK failed: (start + num) <= (size()): ")
    ;
    internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar1);
    internal::LogMessage::~LogMessage(&local_d8);
    this_00 = local_128;
  }
  if (num != 0) {
    local_120 = uVar5;
    local_118 = uVar4;
    if (elements == 0) {
      internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x57e);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_110,"CHECK failed: (elements) != (nullptr): ");
      pLVar1 = internal::LogMessage::operator<<
                         (pLVar1,
                          "Releasing elements without transferring ownership is an unsafe operation.  Use UnsafeArenaExtractSubrange."
                         );
      internal::LogFinisher::operator=(&local_129,pLVar1);
      this_00 = local_128;
      internal::LogMessage::~LogMessage(&local_110);
    }
    else if (this_00->arena_ == (Arena *)0x0) {
      if (0 < (int)num) {
        uVar5 = 0;
        do {
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (this_00,start + (int)uVar5);
          *(Type **)(elements + uVar5 * 8) = pTVar3;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
    }
    else if (0 < (int)num) {
      uVar5 = 0;
      do {
        internal::RepeatedPtrFieldBase::
        Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (this_00,start + (int)uVar5);
        psVar2 = (string *)operator_new(0x20);
        this_00 = local_128;
        *(string **)psVar2 = psVar2 + 0x10;
        *(undefined8 *)(psVar2 + 8) = 0;
        psVar2[0x10] = (string)0x0;
        std::__cxx11::string::_M_assign(psVar2);
        *(string **)(elements + uVar5 * 8) = psVar2;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    internal::RepeatedPtrFieldBase::CloseGap(this_00,(int)local_120,(int)local_118);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::true_type) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num == 0) return;

  GOOGLE_DCHECK_NE(elements, nullptr)
      << "Releasing elements without transferring ownership is an unsafe "
         "operation.  Use UnsafeArenaExtractSubrange.";
  if (elements == nullptr) {
    CloseGap(start, num);
    return;
  }

  Arena* arena = GetArena();
#ifdef PROTOBUF_FORCE_COPY_IN_RELEASE
  // Always copy.
  for (int i = 0; i < num; ++i) {
    elements[i] = copy<TypeHandler>(
        RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start));
  }
  if (arena == nullptr) {
    for (int i = 0; i < num; ++i) {
      delete RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
    }
  }
#else   // PROTOBUF_FORCE_COPY_IN_RELEASE
  // If we're on an arena, we perform a copy for each element so that the
  // returned elements are heap-allocated. Otherwise, just forward it.
  if (arena != nullptr) {
    for (int i = 0; i < num; ++i) {
      elements[i] = copy<TypeHandler>(
          RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start));
    }
  } else {
    for (int i = 0; i < num; ++i) {
      elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
    }
  }
#endif  // !PROTOBUF_FORCE_COPY_IN_RELEASE
  CloseGap(start, num);
}